

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::setSystemMenu(QMdiSubWindow *this,QMenu *systemMenu)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  QMenu *pQVar4;
  undefined8 uVar5;
  int *piVar6;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  piVar6 = *(int **)(lVar2 + 0x308);
  if (systemMenu != (QMenu *)0x0) {
    if ((piVar6 == (int *)0x0) || (piVar6[1] == 0)) {
      pQVar4 = (QMenu *)0x0;
    }
    else {
      pQVar4 = *(QMenu **)(lVar2 + 0x310);
    }
    if (pQVar4 == systemMenu) {
      setSystemMenu();
      return;
    }
  }
  if (((piVar6 != (int *)0x0) && (piVar6[1] != 0)) &&
     (plVar3 = *(long **)(lVar2 + 0x310), plVar3 != (long *)0x0)) {
    puVar1 = (undefined8 *)(lVar2 + 0x308);
    if (piVar6[1] == 0) {
      *puVar1 = 0;
      *(undefined8 *)(lVar2 + 0x310) = 0;
    }
    else {
      (**(code **)(*plVar3 + 0x20))(plVar3);
      piVar6 = (int *)*puVar1;
      *puVar1 = 0;
      *(undefined8 *)(lVar2 + 0x310) = 0;
      if (piVar6 == (int *)0x0) goto LAB_0044f614;
    }
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      operator_delete(piVar6);
    }
  }
LAB_0044f614:
  if (systemMenu != (QMenu *)0x0) {
    if (*(QMdiSubWindow **)(*(long *)&(systemMenu->super_QWidget).field_0x8 + 0x10) != this) {
      QWidget::setParent(&systemMenu->super_QWidget,&this->super_QWidget);
    }
    uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)systemMenu);
    piVar6 = *(int **)(lVar2 + 0x308);
    *(undefined8 *)(lVar2 + 0x308) = uVar5;
    *(QMenu **)(lVar2 + 0x310) = systemMenu;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        operator_delete(piVar6);
        return;
      }
    }
  }
  return;
}

Assistant:

void QMdiSubWindow::setSystemMenu(QMenu *systemMenu)
{
    Q_D(QMdiSubWindow);
    if (Q_UNLIKELY(systemMenu && systemMenu == d->systemMenu)) {
        qWarning("QMdiSubWindow::setSystemMenu: system menu is already set");
        return;
    }

    if (d->systemMenu) {
        delete d->systemMenu;
        d->systemMenu = nullptr;
    }

    if (!systemMenu)
        return;

    if (systemMenu->parent() != this)
        systemMenu->setParent(this);
    d->systemMenu = systemMenu;
}